

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_req_handlers.cxx
# Opt level: O1

bool __thiscall
cornerstone::raft_server::handle_snapshot_sync_req(raft_server *this,snapshot_sync_req *req)

{
  element_type *peVar1;
  element_type *peVar2;
  element_type *peVar3;
  long *plVar4;
  ulong uVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  snapshot *psVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  int iVar9;
  bool bVar10;
  snapshot *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  snapshot local_58;
  ulong local_30;
  
  peVar1 = (this->state_machine_).
           super___shared_ptr<cornerstone::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_state_machine[5])
            (peVar1,(req->snapshot_).
                    super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             req->offset_,
             (req->data_)._M_t.
             super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>._M_t.
             super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>.
             super__Head_base<0UL,_cornerstone::buffer_*,_false>._M_head_impl);
  bVar10 = true;
  if (req->done_ == true) {
    peVar2 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_68 = &local_58;
    if (this->role_ != follower) {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"bad server role for applying a snapshot, exit for debugging",
                 "");
      (*peVar2->_vptr_logger[5])(peVar2,&local_68);
      if (local_68 != &local_58) {
        operator_delete(local_68,local_58.last_log_idx_ + 1);
      }
      plVar4 = *(long **)&(((this->ctx_)._M_t.
                            super___uniq_ptr_impl<cornerstone::context,_std::default_delete<cornerstone::context>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cornerstone::context_*,_std::default_delete<cornerstone::context>_>
                            .super__Head_base<0UL,_cornerstone::context_*,_false>._M_head_impl)->
                          state_mgr_).
                          super___shared_ptr<cornerstone::state_mgr,_(__gnu_cxx::_Lock_policy)2>;
      (**(code **)(*plVar4 + 0x40))(plVar4,0xffffffff);
LAB_0014fe19:
      exit(-1);
    }
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"sucessfully receive a snapshot from leader","");
    (*peVar2->_vptr_logger[2])(peVar2,&local_68);
    if (local_68 != &local_58) {
      operator_delete(local_68,local_58.last_log_idx_ + 1);
    }
    peVar3 = (this->log_store_).
             super___shared_ptr<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar9 = (*peVar3->_vptr_log_store[0xc])
                      (peVar3,((req->snapshot_).
                               super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->last_log_idx_);
    if ((char)iVar9 == '\0') {
      peVar2 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      local_68 = &local_58;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,
                 "failed to compact the log store after a snapshot is received, will ask the leader to retry"
                 ,"");
      (*peVar2->_vptr_logger[5])(peVar2,&local_68);
      if (local_68 != &local_58) {
        operator_delete(local_68,local_58.last_log_idx_ + 1);
      }
      bVar10 = false;
    }
    else {
      stop_election_timer(this);
      peVar2 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      local_68 = &local_58;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,
                 "successfully compact the log store, will now ask the statemachine to apply the snapshot"
                 ,"");
      (*peVar2->_vptr_logger[3])(peVar2,&local_68);
      if (local_68 != &local_58) {
        operator_delete(local_68,local_58.last_log_idx_ + 1);
      }
      peVar1 = (this->state_machine_).
               super___shared_ptr<cornerstone::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar9 = (*peVar1->_vptr_state_machine[6])
                        (peVar1,(req->snapshot_).
                                super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr);
      if ((char)iVar9 == '\0') {
        peVar2 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        local_68 = &local_58;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,
                   "failed to apply the snapshot after log compacted, to ensure the safety, will shutdown the system"
                   ,"");
        (*peVar2->_vptr_logger[3])(peVar2,&local_68);
        if (local_68 != &local_58) {
          operator_delete(local_68,local_58.last_log_idx_ + 1);
        }
        plVar4 = *(long **)&(((this->ctx_)._M_t.
                              super___uniq_ptr_impl<cornerstone::context,_std::default_delete<cornerstone::context>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cornerstone::context_*,_std::default_delete<cornerstone::context>_>
                              .super__Head_base<0UL,_cornerstone::context_*,_false>._M_head_impl)->
                            state_mgr_).
                            super___shared_ptr<cornerstone::state_mgr,_(__gnu_cxx::_Lock_policy)2>;
        (**(code **)(*plVar4 + 0x40))(plVar4,0xffffffff);
        goto LAB_0014fe19;
      }
      reconfigure(this,&((req->snapshot_).
                         super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->last_config_);
      plVar4 = *(long **)&(((this->ctx_)._M_t.
                            super___uniq_ptr_impl<cornerstone::context,_std::default_delete<cornerstone::context>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cornerstone::context_*,_std::default_delete<cornerstone::context>_>
                            .super__Head_base<0UL,_cornerstone::context_*,_false>._M_head_impl)->
                          state_mgr_).
                          super___shared_ptr<cornerstone::state_mgr,_(__gnu_cxx::_Lock_policy)2>;
      (**(code **)(*plVar4 + 0x18))
                (plVar4,(this->config_).
                        super___shared_ptr<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
      uVar5 = ((req->snapshot_).
               super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              last_log_idx_;
      this->sm_commit_index_ = uVar5;
      this->quick_commit_idx_ = uVar5;
      plVar4 = *(long **)&(((this->ctx_)._M_t.
                            super___uniq_ptr_impl<cornerstone::context,_std::default_delete<cornerstone::context>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cornerstone::context_*,_std::default_delete<cornerstone::context>_>
                            .super__Head_base<0UL,_cornerstone::context_*,_false>._M_head_impl)->
                          state_mgr_).
                          super___shared_ptr<cornerstone::state_mgr,_(__gnu_cxx::_Lock_policy)2>;
      (**(code **)(*plVar4 + 0x20))
                (plVar4,(this->state_).
                        super___shared_ptr<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
      peVar6 = (req->snapshot_).
               super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_30 = peVar6->last_log_idx_;
      local_58.last_config_.
      super___shared_ptr<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar6->last_log_term_;
      local_58.last_config_.
      super___shared_ptr<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)peVar6->size_;
      local_68 = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<cornerstone::snapshot,std::allocator<cornerstone::snapshot>,unsigned_long,unsigned_long,std::shared_ptr<cornerstone::cluster_config>&,unsigned_long>
                (&_Stack_60,&local_68,
                 (allocator<cornerstone::snapshot> *)((long)&local_58.size_ + 7),&local_30,
                 (unsigned_long *)
                 &local_58.last_config_.
                  super___shared_ptr<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,&this->config_,(unsigned_long *)&local_58.last_config_);
      _Var8._M_pi = _Stack_60._M_pi;
      psVar7 = local_68;
      local_68 = (snapshot *)0x0;
      _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_00 = (this->last_snapshot_).
                super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      (this->last_snapshot_).super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = psVar7;
      (this->last_snapshot_).super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var8._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      if (_Stack_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_60._M_pi);
      }
      restart_election_timer(this);
      peVar2 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      local_68 = &local_58;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"snapshot is successfully applied","");
      (*peVar2->_vptr_logger[3])(peVar2,&local_68);
      if (local_68 != &local_58) {
        operator_delete(local_68,local_58.last_log_idx_ + 1);
      }
    }
  }
  return bVar10;
}

Assistant:

bool raft_server::handle_snapshot_sync_req(snapshot_sync_req& req)
{
    try
    {
        state_machine_->save_snapshot_data(req.get_snapshot(), req.get_offset(), req.get_data());
        if (req.is_done())
        {
            // Only follower will run this piece of code, but let's check it again
            if (role_ != srv_role::follower)
            {
                l_->err("bad server role for applying a snapshot, exit for debugging");
                ctx_->state_mgr_->system_exit(-1);
                ::exit(-1);
            }

            l_->debug("sucessfully receive a snapshot from leader");
            if (log_store_->compact(req.get_snapshot().get_last_log_idx()))
            {
                // The state machine will not be able to commit anything before the snapshot is applied, so make this
                // synchronously with election timer stopped as usually applying a snapshot may take a very long time
                stop_election_timer();
                l_->info("successfully compact the log store, will now ask the statemachine to apply the snapshot");
                if (!state_machine_->apply_snapshot(req.get_snapshot()))
                {
                    l_->info("failed to apply the snapshot after log compacted, to ensure the safety, will shutdown "
                             "the system");
                    ctx_->state_mgr_->system_exit(-1);
                    ::exit(-1);
                    return false;
                }

                reconfigure(req.get_snapshot().get_last_config());
                ctx_->state_mgr_->save_config(*config_);
                sm_commit_index_ = req.get_snapshot().get_last_log_idx();
                quick_commit_idx_ = req.get_snapshot().get_last_log_idx();
                ctx_->state_mgr_->save_state(*state_);
                last_snapshot_ = cs_new<snapshot>(
                    req.get_snapshot().get_last_log_idx(),
                    req.get_snapshot().get_last_log_term(),
                    config_,
                    req.get_snapshot().size());
                restart_election_timer();
                l_->info("snapshot is successfully applied");
            }
            else
            {
                l_->err("failed to compact the log store after a snapshot is received, will ask the leader to retry");
                return false;
            }
        }
    }
    catch (...)
    {
        l_->err("failed to handle snapshot installation due to system errors");
        ctx_->state_mgr_->system_exit(-1);
        ::exit(-1);
        return false;
    }

    return true;
}